

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O3

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false>::operator()
          (DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false>
           *this,value_type value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (value != (value_type)0x0) {
    pcVar2 = (value->InterfaceIncludeDirectories)._M_dataplus._M_p;
    paVar1 = &(value->InterfaceIncludeDirectories).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    pcVar2 = (value->TargetName)._M_dataplus._M_p;
    paVar1 = &(value->TargetName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(value,0x80);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const { delete value; }